

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructPrim<tinyusdz::Material>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,Material *material
               ,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  __type _Var2;
  Property *pPVar3;
  Attribute *this;
  AttrMeta *pAVar4;
  AttrMeta *pAVar5;
  size_type sVar6;
  mapped_type *this_00;
  ostream *poVar7;
  string *psVar8;
  bool local_d01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8 [32];
  string local_c88 [32];
  ostringstream local_c68 [8];
  ostringstream ss_w_1;
  allocator local_ac9;
  value_type local_ac8 [4];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_aa8;
  allocator local_a81;
  string local_a80;
  undefined1 local_a60 [8];
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fun;
  Attribute *attr;
  allocator local_a21;
  value_type local_a20 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a00 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e0 [32];
  ostringstream local_9c0 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  string local_828;
  allocator local_801;
  key_type local_800 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0 [39];
  allocator local_799;
  string local_798 [32];
  string local_778;
  ostringstream local_758 [8];
  ostringstream ss_e_2;
  allocator local_5d9;
  string local_5d8;
  string local_5b8;
  undefined1 local_598 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550 [39];
  allocator local_529;
  string local_528 [32];
  string local_508;
  ostringstream local_4e8 [8];
  ostringstream ss_e_1;
  allocator local_369;
  string local_368;
  string local_348;
  undefined1 local_328 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0 [39];
  allocator local_2b9;
  string local_2b8 [32];
  string local_298;
  ostringstream local_278 [8];
  ostringstream ss_e;
  int local_100;
  allocator local_f9;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  Material *material_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range2);
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin(properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end(properties);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
    ret.err.field_2._8_8_ =
         ::std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
         ::operator*(&__end2);
    ::std::__cxx11::string::string((string *)&local_d8,(string *)ret.err.field_2._8_8_);
    pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f8,"outputs:surface",&local_f9);
    psVar8 = &local_f8;
    anon_unknown_0::ParseShaderInputConnectionProperty
              ((ParseResult *)local_b8,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2,&local_d8,pPVar3,psVar8,&material->surface);
    ::std::__cxx11::string::~string((string *)&local_f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    ::std::__cxx11::string::~string((string *)&local_d8);
    if ((local_b8._0_4_ == Success) || (local_b8._0_4_ == AlreadyProcessed)) {
      local_100 = 3;
    }
    else if (local_b8._0_4_ == Unmatched) {
      local_100 = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_278);
      poVar7 = ::std::operator<<((ostream *)local_278,"[error]");
      poVar7 = ::std::operator<<(poVar7,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar7 = ::std::operator<<(poVar7,":");
      poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
      poVar7 = ::std::operator<<(poVar7,"():");
      poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1314);
      ::std::operator<<(poVar7," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2b8,"Parsing shader property `{}` failed. Error: {}",&local_2b9);
      fmt::format<char[16],std::__cxx11::string>
                (&local_298,(fmt *)local_2b8,(string *)"outputs:surface",(char (*) [16])&ret,psVar8)
      ;
      poVar7 = ::std::operator<<((ostream *)local_278,(string *)&local_298);
      ::std::operator<<(poVar7,"\n");
      ::std::__cxx11::string::~string((string *)&local_298);
      ::std::__cxx11::string::~string(local_2b8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
      if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_2e0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ret_1.err.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=
                  ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)local_2e0);
        ::std::__cxx11::string::~string((string *)local_2e0);
        ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      local_100 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_278);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_b8);
    if (local_100 == 0) {
      ::std::__cxx11::string::string((string *)&local_348,(string *)ret.err.field_2._8_8_);
      pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_368,"outputs:displacement",&local_369);
      psVar8 = &local_368;
      anon_unknown_0::ParseShaderInputConnectionProperty
                ((ParseResult *)local_328,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,&local_348,pPVar3,psVar8,&material->displacement);
      ::std::__cxx11::string::~string((string *)&local_368);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_369);
      ::std::__cxx11::string::~string((string *)&local_348);
      if ((local_328._0_4_ == Success) || (local_328._0_4_ == AlreadyProcessed)) {
        local_100 = 3;
      }
      else if (local_328._0_4_ == Unmatched) {
        local_100 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4e8);
        poVar7 = ::std::operator<<((ostream *)local_4e8,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1316);
        ::std::operator<<(poVar7," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_528,"Parsing shader property `{}` failed. Error: {}",&local_529);
        fmt::format<char[21],std::__cxx11::string>
                  (&local_508,(fmt *)local_528,(string *)"outputs:displacement",
                   (char (*) [21])&ret_1,psVar8);
        poVar7 = ::std::operator<<((ostream *)local_4e8,(string *)&local_508);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_508);
        ::std::__cxx11::string::~string(local_528);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_529);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_550,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_2.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_550);
          ::std::__cxx11::string::~string((string *)local_550);
          ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_100 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_4e8);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_328);
      if (local_100 != 0) goto joined_r0x002d1811;
      ::std::__cxx11::string::string((string *)&local_5b8,(string *)ret.err.field_2._8_8_);
      pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_5d8,"outputs:volume",&local_5d9);
      psVar8 = &local_5d8;
      anon_unknown_0::ParseShaderInputConnectionProperty
                ((ParseResult *)local_598,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,&local_5b8,pPVar3,psVar8,&material->volume);
      ::std::__cxx11::string::~string((string *)&local_5d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
      ::std::__cxx11::string::~string((string *)&local_5b8);
      if ((local_598._0_4_ == Success) || (local_598._0_4_ == AlreadyProcessed)) {
        local_100 = 3;
      }
      else if (local_598._0_4_ == Unmatched) {
        local_100 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_758);
        poVar7 = ::std::operator<<((ostream *)local_758,"[error]");
        poVar7 = ::std::operator<<(poVar7,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar7 = ::std::operator<<(poVar7,":");
        poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
        poVar7 = ::std::operator<<(poVar7,"():");
        poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x1318);
        ::std::operator<<(poVar7," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_798,"Parsing shader property `{}` failed. Error: {}",&local_799);
        fmt::format<char[15],std::__cxx11::string>
                  (&local_778,(fmt *)local_798,(string *)"outputs:volume",(char (*) [15])&ret_2,
                   psVar8);
        poVar7 = ::std::operator<<((ostream *)local_758,(string *)&local_778);
        ::std::operator<<(poVar7,"\n");
        ::std::__cxx11::string::~string((string *)&local_778);
        ::std::__cxx11::string::~string(local_798);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_799);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_7c0,local_7e0);
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_7c0);
          ::std::__cxx11::string::~string((string *)local_7c0);
          ::std::__cxx11::string::~string((string *)local_7e0);
        }
        spec_local._7_1_ = 0;
        local_100 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_758);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_598);
      if (local_100 != 0) goto joined_r0x002d1811;
      bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )ret.err.field_2._8_8_,"purpose");
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)local_800,"purpose",&local_801);
        sVar6 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range2,local_800);
        ::std::__cxx11::string::~string((string *)local_800);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_801);
        if (sVar6 == 0) {
          Property::value_type_name_abi_cxx11_
                    (&local_828,(Property *)(ret.err.field_2._8_8_ + 0x20));
          tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
          _Var2 = ::std::operator==(&local_828,&local_848);
          local_d01 = false;
          if (_Var2) {
            bVar1 = Property::is_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
            local_d01 = false;
            if (bVar1) {
              local_d01 = Property::is_empty((Property *)(ret.err.field_2._8_8_ + 0x20));
            }
          }
          ::std::__cxx11::string::~string((string *)&local_848);
          ::std::__cxx11::string::~string((string *)&local_828);
          if (local_d01 == false) {
            fun._M_invoker =
                 (_Invoker_type)Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
            ::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(&)(std::__cxx11::string_const&),void>
                      ((function<nonstd::expected_lite::expected<tinyusdz::Purpose,std::__cxx11::string>(std::__cxx11::string_const&)>
                        *)local_a60,PurposeEnumHandler);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_a80,"purpose",&local_a81);
            bVar1 = options->strict_allowedToken_check;
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::function(&local_aa8,
                       (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)local_a60);
            bVar1 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                              (&local_a80,(bool)(bVar1 & 1),&local_aa8,(Attribute *)fun._M_invoker,
                               &(material->super_UsdShadePrim).purpose,warn,
                               (string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count);
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::~function(&local_aa8);
            ::std::__cxx11::string::~string((string *)&local_a80);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_a81);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              pAVar4 = Attribute::metas((Attribute *)fun._M_invoker);
              pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas
                                 (&(material->super_UsdShadePrim).purpose);
              AttrMetas::operator=(pAVar5,pAVar4);
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string((string *)local_ac8,"purpose",&local_ac9);
              ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range2,local_ac8);
              ::std::__cxx11::string::~string((string *)local_ac8);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
              local_100 = 3;
            }
            else {
              spec_local._7_1_ = 0;
              local_100 = 1;
            }
            ::std::
            function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::~function((function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                         *)local_a60);
            goto joined_r0x002d1811;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_9c0);
          poVar7 = ::std::operator<<((ostream *)local_9c0,"[warn]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x131a);
          ::std::operator<<(poVar7," ");
          poVar7 = ::std::operator<<((ostream *)local_9c0,"No value assigned to `");
          poVar7 = ::std::operator<<(poVar7,"purpose");
          poVar7 = ::std::operator<<(poVar7,"` token attribute. Set default token value.");
          ::std::operator<<(poVar7,"\n");
          if (warn != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_9e0,local_a00);
            ::std::__cxx11::string::operator=((string *)warn,(string *)local_9e0);
            ::std::__cxx11::string::~string((string *)local_9e0);
            ::std::__cxx11::string::~string((string *)local_a00);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_9c0);
          this = Property::get_attribute((Property *)(ret.err.field_2._8_8_ + 0x20));
          pAVar4 = Attribute::metas(this);
          pAVar5 = TypedAttributeWithFallback<tinyusdz::Purpose>::metas
                             (&(material->super_UsdShadePrim).purpose);
          AttrMetas::operator=(pAVar5,pAVar4);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)local_a20,"purpose",&local_a21);
          ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2,local_a20);
          ::std::__cxx11::string::~string((string *)local_a20);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_a21);
        }
      }
      else {
        sVar6 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range2,(key_type *)ret.err.field_2._8_8_);
        if (sVar6 == 0) {
          pPVar3 = (Property *)(ret.err.field_2._8_8_ + 0x20);
          this_00 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                    ::operator[](&(material->super_UsdShadePrim).props,
                                 (key_type *)ret.err.field_2._8_8_);
          Property::operator=(this_00,pPVar3);
          ::std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2,(value_type_conflict *)ret.err.field_2._8_8_);
        }
        sVar6 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range2,(key_type *)ret.err.field_2._8_8_);
        if (sVar6 == 0) {
          ::std::__cxx11::ostringstream::ostringstream(local_c68);
          poVar7 = ::std::operator<<((ostream *)local_c68,"[warn]");
          poVar7 = ::std::operator<<(poVar7,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                    );
          poVar7 = ::std::operator<<(poVar7,":");
          poVar7 = ::std::operator<<(poVar7,"ReconstructPrim");
          poVar7 = ::std::operator<<(poVar7,"():");
          poVar7 = (ostream *)::std::ostream::operator<<(poVar7,0x131c);
          ::std::operator<<(poVar7," ");
          ::std::operator+((char *)local_c88,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "Unsupported/unimplemented property: ");
          poVar7 = ::std::operator<<((ostream *)local_c68,local_c88);
          ::std::operator<<(poVar7,"\n");
          ::std::__cxx11::string::~string(local_c88);
          if (warn != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(local_ca8,local_cc8);
            ::std::__cxx11::string::operator=((string *)warn,(string *)local_ca8);
            ::std::__cxx11::string::~string((string *)local_ca8);
            ::std::__cxx11::string::~string((string *)local_cc8);
          }
          ::std::__cxx11::ostringstream::~ostringstream(local_c68);
        }
      }
    }
    else {
joined_r0x002d1811:
      if (local_100 != 3) goto LAB_002d19e9;
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
    ::operator++(&__end2);
  }
  spec_local._7_1_ = 1;
LAB_002d19e9:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range2);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructPrim<Material>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    Material *material,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;

  // TODO: special treatment for properties with 'inputs' and 'outputs' namespace.

  // For `Material`, `outputs` are terminal attribute and treated as input attribute with connection(Should be "token output:surface.connect = </path/to/shader>").
  for (auto &prop : properties) {
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:surface",
                                  Material, material->surface)
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:displacement",
                                  Material, material->displacement)
    PARSE_SHADER_INPUT_CONNECTION_PROPERTY(table, prop, "outputs:volume",
                                  Material, material->volume)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, kPurpose, Purpose, PurposeEnumHandler, Material,
                       material->purpose, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, Material, material->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}